

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall GuidedMeshNormalFiltering::initParameters(GuidedMeshNormalFiltering *this)

{
  ParameterSet *pPVar1;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  GuidedMeshNormalFiltering *local_10;
  GuidedMeshNormalFiltering *this_local;
  
  local_10 = this;
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Denoise Type",&local_31);
  ParameterSet::addParameter(pPVar1,(string *)local_30,0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Face Neighbor",&local_69);
  ParameterSet::addParameter(pPVar1,(string *)local_68,0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"include central face",&local_91);
  ParameterSet::addParameter(pPVar1,(string *)local_90,true);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Multiple(* avg face dis.)",&local_b9);
  ParameterSet::addParameter(pPVar1,(string *)local_b8,2.0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Multiple(* sigma_s)",&local_e1);
  ParameterSet::addParameter(pPVar1,(string *)local_e0,1.0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"sigma_r",&local_109);
  ParameterSet::addParameter(pPVar1,(string *)local_108,0.35);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"(Local)Normal Iteration Num.",&local_131);
  ParameterSet::addParameter(pPVar1,(string *)local_130,0x14);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"(Global)Normal Iteration Num.",&local_159);
  ParameterSet::addParameter(pPVar1,(string *)local_158,1);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"smoothness",&local_181);
  ParameterSet::addParameter(pPVar1,(string *)local_180,0.01);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"Vertex Iteration Num.",&local_1a9);
  ParameterSet::addParameter(pPVar1,(string *)local_1a8,10);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  return;
}

Assistant:

void GuidedMeshNormalFiltering::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Denoise Type"), 0);


    parameter_set_->addParameter(string("Face Neighbor"), 0);
    parameter_set_->addParameter(string("include central face"), true);

    parameter_set_->addParameter(string("Multiple(* avg face dis.)"), 2.0);
    parameter_set_->addParameter(string("Multiple(* sigma_s)"), 1.0);

    parameter_set_->addParameter(string("sigma_r"), 0.35);

    parameter_set_->addParameter(string("(Local)Normal Iteration Num."), 20);
    parameter_set_->addParameter(string("(Global)Normal Iteration Num."), 1);

    parameter_set_->addParameter(string("smoothness"), 0.01);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 10);
}